

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxbasis.h
# Opt level: O0

void __thiscall
soplex::SPxBasisBase<double>::coSolve
          (SPxBasisBase<double> *this,SSVectorBase<double> *x,SVectorBase<double> *rhs)

{
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var1;
  int iVar2;
  SVectorBase<double> *in_RDX;
  undefined8 in_RSI;
  SSVectorBase<double> *in_RDI;
  SPxBasisBase<double> *in_stack_000000a0;
  
  iVar2 = SVectorBase<double>::size(in_RDX);
  if (iVar2 == 0) {
    SSVectorBase<double>::clear(in_RDI);
  }
  else {
    if (((ulong)in_RDI[1].super_IdxSet._vptr_IdxSet & 1) == 0) {
      factorize(in_stack_000000a0);
    }
    p_Var1 = (in_RDI->_tolerances).
             super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
    (*p_Var1->_vptr__Sp_counted_base[0x16])(p_Var1,in_RSI,in_RDX);
  }
  return;
}

Assistant:

void coSolve(SSVectorBase<R>& x, const SVectorBase<R>& rhs)
   {
      if(rhs.size() == 0)
      {
         x.clear();
         return;
      }

      if(!factorized)
         SPxBasisBase<R>::factorize();

      factor->solveLeft(x, rhs);
   }